

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStringConst(PrintExpressionContents *this,StringConst *curr)

{
  ostream *stream;
  String *this_00;
  bool bVar1;
  char *in_RCX;
  string_view str;
  stringstream local_1c8 [8];
  stringstream wtf8;
  ostream local_1b8 [112];
  ios_base local_148 [264];
  long *local_40;
  ostream *local_38;
  long local_30 [2];
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"string.const ",0xd);
  Colors::outputColorCode(stream,"\x1b[0m");
  std::__cxx11::stringstream::stringstream(local_1c8);
  bVar1 = String::convertWTF16ToWTF8(local_1b8,(curr->string).super_IString.str);
  if (bVar1) {
    this_00 = (String *)this->o;
    std::__cxx11::stringbuf::str();
    str._M_str = in_RCX;
    str._M_len = (size_t)local_40;
    String::printEscaped(this_00,local_38,str);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1c8);
    std::ios_base::~ios_base(local_148);
    return;
  }
  __assert_fail("valid",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9c2,"void wasm::PrintExpressionContents::visitStringConst(StringConst *)");
}

Assistant:

void visitStringConst(StringConst* curr) {
    printMedium(o, "string.const ");
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid =
      String::convertWTF16ToWTF8(wtf8, curr->string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    String::printEscaped(o, wtf8.str());
  }